

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

bool __thiscall
duckdb::Node::PrefixContainsOther
          (Node *this,ART *art,Node *l_node,Node *r_node,uint8_t pos,GateStatus status)

{
  uint8_t byte;
  bool bVar1;
  unsafe_optional_ptr<Node> this_00;
  undefined7 in_register_00000081;
  ulong pos_00;
  Prefix prefix;
  Prefix local_48;
  
  pos_00 = CONCAT71(in_register_00000081,pos) & 0xffffffff;
  Prefix::Prefix(&local_48,art,(Node)(r_node->super_IndexPointer).data,false,false);
  byte = local_48.data[pos_00];
  this_00 = GetChildInternal<duckdb::Node_const>(art,l_node,byte);
  Prefix::Reduce(art,r_node,pos_00);
  if (this_00.ptr == (Node *)0x0) {
    InsertChild(art,l_node,byte,(Node)(r_node->super_IndexPointer).data);
    (r_node->super_IndexPointer).data = 0;
    bVar1 = true;
  }
  else {
    bVar1 = MergeInternal(this_00.ptr,art,r_node,status);
  }
  return bVar1;
}

Assistant:

bool Node::PrefixContainsOther(ART &art, Node &l_node, Node &r_node, const uint8_t pos, const GateStatus status) {
	// r_node's prefix contains l_node's prefix. l_node must be a node with child nodes.
	D_ASSERT(l_node.IsNode());

	// Check if the next byte (pos) in r_node exists in l_node.
	auto byte = Prefix::GetByte(art, r_node, pos);
	auto child = l_node.GetChildMutable(art, byte);

	// Reduce r_node's prefix to the bytes after pos.
	Prefix::Reduce(art, r_node, pos);
	if (child) {
		return child->MergeInternal(art, r_node, status);
	}

	Node::InsertChild(art, l_node, byte, r_node);
	r_node.Clear();
	return true;
}